

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall
Internal_FakeWindowsLogfontName::Internal_FakeWindowsLogfontName
          (Internal_FakeWindowsLogfontName *this,wchar_t *family_name,wchar_t *postscript_name,
          wchar_t *fake_logfont_name,Member quartet_member)

{
  bool bVar1;
  Member quartet_member_local;
  wchar_t *fake_logfont_name_local;
  wchar_t *postscript_name_local;
  wchar_t *family_name_local;
  Internal_FakeWindowsLogfontName *this_local;
  
  NameHash(&this->m_family_and_postcript_name_hash,family_name,postscript_name);
  ON_wString::ON_wString(&this->m_fake_logfont_name,fake_logfont_name);
  this->m_quartet_member = quartet_member;
  ON_wString::TrimLeftAndRight(&this->m_fake_logfont_name,(wchar_t *)0x0);
  bVar1 = ON_wString::EqualOrdinal(&this->m_fake_logfont_name,family_name,true);
  if ((bVar1) ||
     (((quartet_member != Unset && (bVar1 = ON_wString::IsEmpty(&this->m_fake_logfont_name), bVar1))
      || (bVar1 = ON_SHA1_Hash::IsZeroDigestOrEmptyContentHash
                            (&this->m_family_and_postcript_name_hash), bVar1)))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x1d45,"","Invalid input.");
    ON_wString::operator=(&this->m_fake_logfont_name,&ON_wString::EmptyString);
    *(undefined8 *)(this->m_family_and_postcript_name_hash).m_digest =
         ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_family_and_postcript_name_hash).m_digest + 8) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined4 *)((this->m_family_and_postcript_name_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    this->m_quartet_member = Unset;
  }
  return;
}

Assistant:

Internal_FakeWindowsLogfontName(
    const wchar_t* family_name,
    const wchar_t* postscript_name,
    const wchar_t* fake_logfont_name,
    ON_FontFaceQuartet::Member quartet_member
  )
  : m_fake_logfont_name(fake_logfont_name)
  , m_family_and_postcript_name_hash(Internal_FakeWindowsLogfontName::NameHash(family_name, postscript_name))
  , m_quartet_member(quartet_member)
  // for debugging
  //, m_family_name(family_name)
  //, m_postscript_name(postscript_name)
  {
    m_fake_logfont_name.TrimLeftAndRight();
    if (
      m_fake_logfont_name.EqualOrdinal(family_name, true)
      || (ON_FontFaceQuartet::Member::Unset != quartet_member && m_fake_logfont_name.IsEmpty())
      || m_family_and_postcript_name_hash.IsZeroDigestOrEmptyContentHash()
      )
    {
      ON_ERROR("Invalid input.");
      m_fake_logfont_name = ON_wString::EmptyString;
      m_family_and_postcript_name_hash = ON_SHA1_Hash::EmptyContentHash;
      m_quartet_member = ON_FontFaceQuartet::Member::Unset;
    }
  }